

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool Catch::startsWith(string *s,string *prefix)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RDI;
  __type local_3a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  local_3a = false;
  if (uVar2 <= uVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffffc8,in_RDI);
    local_3a = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return local_3a;
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && s.substr( 0, prefix.size() ) == prefix;
    }